

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
Prepend(SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        *this,ArenaAllocator *allocator,ObjectBeforeCollectCallbackData *data)

{
  Type pSVar1;
  Type pSVar2;
  Type pSVar3;
  Type pSVar4;
  
  pSVar4 = (Type)new<Memory::ArenaAllocator>(0x30,allocator,0x35916e);
  pSVar1 = (Type)data->callback;
  pSVar2 = (Type)data->callbackState;
  pSVar3 = (Type)data->threadContext;
  pSVar4[1].next = (Type)data->object;
  pSVar4[2].next = pSVar1;
  pSVar4[3].next = pSVar2;
  pSVar4[4].next = pSVar3;
  pSVar4[5].next = (Type)data->callbackWrapper;
  pSVar4->next = (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (this->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar4;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }